

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O1

int ncnn::rnn_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  uint _w;
  uint _w_00;
  size_t sVar2;
  void *pvVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined4 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined8 uVar28;
  int *piVar35;
  long lVar36;
  void *pvVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  void *pvVar45;
  uint uVar46;
  void *pvVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  Option opt_quant_1;
  Mat local_268;
  Mat local_218;
  Mat local_1c8;
  Mat local_178;
  Mat local_128;
  Mat *local_d8;
  Mat *local_d0;
  Mat *local_c8;
  ulong local_c0;
  ulong local_b8;
  float *local_b0;
  void *local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Option local_78;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  undefined4 uVar14;
  undefined3 uVar16;
  undefined2 uVar18;
  undefined4 uVar22;
  undefined3 uVar24;
  undefined2 uVar26;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined3 uVar31;
  undefined1 uVar32;
  undefined2 uVar33;
  undefined1 uVar34;
  
  _w = bottom_blob->w;
  uVar46 = bottom_blob->h;
  _w_00 = top_blob->w;
  uVar42 = (ulong)_w_00;
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218._20_8_ = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  local_d8 = top_blob;
  local_d0 = weight_xc_int8;
  local_c8 = bias_c;
  local_b0 = weight_xc_int8_scales;
  Mat::create(&local_218,_w_00,4,opt->workspace_allocator);
  iVar39 = -100;
  if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0)) {
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,_w,uVar46,1,1,opt->workspace_allocator);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128._20_8_ = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    Mat::create(&local_128,uVar46,4,1,opt->workspace_allocator);
    if (0 < (int)uVar46) {
      pvVar37 = bottom_blob->data;
      iVar39 = bottom_blob->w;
      sVar2 = bottom_blob->elemsize;
      uVar43 = 0;
      do {
        fVar48 = 0.0;
        if (0 < (int)_w) {
          uVar44 = 0;
          do {
            fVar51 = ABS(*(float *)((long)pvVar37 + uVar44 * 4));
            if (fVar48 <= fVar51) {
              fVar48 = fVar51;
            }
            uVar44 = uVar44 + 1;
          } while (_w != uVar44);
        }
        *(float *)((long)local_128.data + uVar43 * 4) = 127.0 / fVar48;
        uVar43 = uVar43 + 1;
        pvVar37 = (void *)((long)pvVar37 + (long)iVar39 * sVar2);
      } while (uVar43 != uVar46);
    }
    local_268.data = *(void **)opt;
    uVar4 = opt->openmp_blocktime;
    uVar5 = opt->use_winograd_convolution;
    uVar7 = opt->use_sgemm_convolution;
    uVar9 = opt->use_int8_inference;
    uVar11 = opt->use_vulkan_compute;
    uVar10 = CONCAT11(uVar11,uVar9);
    uVar8 = CONCAT21(uVar10,uVar7);
    uVar6 = CONCAT31(uVar8,uVar5);
    uVar43._0_1_ = opt->use_bf16_storage;
    uVar43._1_1_ = opt->use_fp16_packed;
    uVar43._2_1_ = opt->use_fp16_storage;
    uVar43._3_1_ = opt->use_fp16_arithmetic;
    uVar43._4_1_ = opt->use_int8_packed;
    uVar43._5_1_ = opt->use_int8_storage;
    uVar43._6_1_ = opt->use_int8_arithmetic;
    uVar43._7_1_ = opt->use_packing_layout;
    uVar12 = opt->vulkan_device_index;
    uVar13 = opt->use_reserved_1;
    uVar15 = opt->use_image_storage;
    uVar17 = opt->use_tensor_storage;
    uVar19 = opt->use_reserved_2;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar14 = CONCAT31(uVar16,uVar13);
    uVar20 = opt->flush_denormals;
    uVar21 = opt->use_local_pool_allocator;
    uVar23 = opt->use_shader_local_memory;
    uVar25 = opt->use_cooperative_matrix;
    uVar27 = opt->use_winograd23_convolution;
    uVar26 = CONCAT11(uVar27,uVar25);
    uVar24 = CONCAT21(uVar26,uVar23);
    uVar22 = CONCAT31(uVar24,uVar21);
    uVar28._0_1_ = opt->use_winograd43_convolution;
    uVar28._1_1_ = opt->use_winograd63_convolution;
    uVar28._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar28._3_1_ = opt->use_fp16_uniform;
    uVar29 = opt->use_int8_uniform;
    uVar30 = opt->use_reserved_9;
    uVar32 = opt->use_reserved_10;
    uVar34 = opt->use_reserved_11;
    uVar33 = CONCAT11(uVar34,uVar32);
    uVar31 = CONCAT21(uVar33,uVar30);
    uVar28._4_4_ = CONCAT31(uVar31,uVar29);
    local_268.c = (int)uVar28;
    local_268.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_268.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_268.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_268.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_268.allocator = (Allocator *)(uVar43 & 0xffffffffffffff);
    local_268.elempack = uVar4;
    local_268._28_4_ = uVar6;
    local_268.dims = uVar12;
    local_268.w = uVar14;
    local_268.h = uVar20;
    local_268.d = uVar22;
    local_268._60_4_ = uVar28._4_4_;
    quantize_to_int8(bottom_blob,&local_178,&local_128,(Option *)&local_268);
    local_268.cstep = 0;
    local_268.data = (void *)0x0;
    local_268.refcount._0_4_ = 0;
    local_268.refcount._4_4_ = 0;
    local_268.elemsize._0_4_ = 0;
    local_268.elemsize._4_4_ = 0;
    local_268.elempack = 0;
    local_268.allocator = (Allocator *)0x0;
    local_268.dims = 0;
    local_268.w = 0;
    local_268.h = 0;
    local_268.d = 0;
    local_268.c = 0;
    Mat::create(&local_268,_w_00,1,1,opt->workspace_allocator);
    local_1c8.cstep = 0;
    local_1c8.data = (float *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8._20_8_ = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    Mat::create(&local_1c8,1,4,1,opt->workspace_allocator);
    if (0 < (int)uVar46) {
      uVar43 = 0;
      local_c0 = (ulong)uVar46;
      do {
        uVar44 = (ulong)(~(uint)uVar43 + (int)local_c0);
        if (reverse == 0) {
          uVar44 = uVar43;
        }
        fVar48 = 0.0;
        if (0 < (int)_w_00) {
          uVar40 = 0;
          do {
            fVar51 = ABS(*(float *)((long)hidden_state->data + uVar40 * 4));
            if (fVar48 <= fVar51) {
              fVar48 = fVar51;
            }
            uVar40 = uVar40 + 1;
          } while (uVar42 != uVar40);
        }
        local_b8 = uVar43;
        if (fVar48 == 0.0) {
          *(float *)local_1c8.data = 1.0;
          if (0 < local_268.c * (int)local_268.cstep) {
            memset(local_268.data,0,(ulong)(uint)(local_268.c * (int)local_268.cstep));
          }
        }
        else {
          *(float *)local_1c8.data = 127.0 / fVar48;
          local_78.lightmode = opt->lightmode;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_ops = opt->use_subgroup_ops;
          local_78.use_reserved_0 = opt->use_reserved_0;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          uVar40._0_1_ = opt->use_bf16_storage;
          uVar40._1_1_ = opt->use_fp16_packed;
          uVar40._2_1_ = opt->use_fp16_storage;
          uVar40._3_1_ = opt->use_fp16_arithmetic;
          uVar40._4_1_ = opt->use_int8_packed;
          uVar40._5_1_ = opt->use_int8_storage;
          uVar40._6_1_ = opt->use_int8_arithmetic;
          uVar40._7_1_ = opt->use_packing_layout;
          local_78.vulkan_device_index = opt->vulkan_device_index;
          local_78.use_reserved_1 = opt->use_reserved_1;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_reserved_2 = opt->use_reserved_2;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_shader_local_memory = opt->use_shader_local_memory;
          local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
          local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
          local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
          local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
          local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          local_78.use_fp16_uniform = opt->use_fp16_uniform;
          local_78.use_int8_uniform = opt->use_int8_uniform;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = opt->workspace_allocator;
          local_78._32_8_ = uVar40 & 0xffffffffffffff;
          quantize_to_int8(hidden_state,&local_268,&local_1c8,&local_78);
        }
        pvVar3 = local_178.data;
        pvVar37 = local_268.data;
        lVar38 = (long)(int)uVar44;
        if (0 < (int)_w_00) {
          lVar41 = (long)local_178.w;
          lVar36 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
          pvVar47 = local_d0->data;
          pvVar45 = weight_hc_int8->data;
          local_98 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
          local_a0 = local_c8->data;
          local_a8 = local_218.data;
          local_88 = CONCAT44(*(undefined4 *)((long)local_128.data + lVar38 * 4),*local_1c8.data);
          uStack_80 = 0;
          local_90 = (long)local_d0->w * local_d0->elemsize;
          uVar43 = 0;
          do {
            if ((int)_w < 1) {
              fVar48 = 0.0;
            }
            else {
              uVar44 = 0;
              iVar39 = 0;
              do {
                iVar39 = iVar39 + (int)*(char *)((long)pvVar3 + uVar44 + lVar41 * lVar38 * lVar36) *
                                  (int)*(char *)((long)pvVar47 + uVar44);
                uVar44 = uVar44 + 1;
              } while (_w != uVar44);
              fVar48 = (float)iVar39;
            }
            uVar44 = 0;
            iVar39 = 0;
            do {
              iVar39 = iVar39 + (int)*(char *)((long)pvVar37 + uVar44) *
                                (int)*(char *)((long)pvVar45 + uVar44);
              uVar44 = uVar44 + 1;
            } while (uVar42 != uVar44);
            auVar49._0_4_ = (float)iVar39;
            auVar49._4_4_ = fVar48;
            auVar49._8_8_ = 0;
            auVar50._4_4_ = local_b0[uVar43] * local_88._4_4_;
            auVar50._0_4_ = weight_hc_int8_scales[uVar43] * (float)local_88;
            auVar50._8_4_ = (float)uStack_80 * 0.0;
            auVar50._12_4_ = uStack_80._4_4_ * 0.0;
            auVar50 = divps(auVar49,auVar50);
            fVar48 = tanhf(auVar50._4_4_ + auVar50._0_4_ + *(float *)((long)local_a0 + uVar43 * 4));
            *(float *)((long)local_a8 + uVar43 * 4) = fVar48;
            uVar43 = uVar43 + 1;
            pvVar47 = (void *)((long)pvVar47 + local_90);
            pvVar45 = (void *)((long)pvVar45 + local_98);
          } while (uVar43 != uVar42);
        }
        if (0 < (int)_w_00) {
          iVar39 = local_d8->w;
          sVar2 = local_d8->elemsize;
          pvVar37 = local_d8->data;
          pvVar3 = hidden_state->data;
          uVar43 = 0;
          do {
            uVar1 = *(undefined4 *)((long)local_218.data + uVar43 * 4);
            *(undefined4 *)((long)pvVar3 + uVar43 * 4) = uVar1;
            *(undefined4 *)((long)pvVar37 + uVar43 * 4 + iVar39 * lVar38 * sVar2) = uVar1;
            uVar43 = uVar43 + 1;
          } while (uVar42 != uVar43);
        }
        uVar46 = (int)local_b8 + 1;
        uVar43 = (ulong)uVar46;
      } while (uVar46 != (uint)local_c0);
    }
    piVar35 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar35 != (int *)0x0) {
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if ((float *)local_1c8.data != (float *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8._20_8_ = 0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    piVar35 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
    if (piVar35 != (int *)0x0) {
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        if (local_268.allocator == (Allocator *)0x0) {
          if (local_268.data != (void *)0x0) {
            free(local_268.data);
          }
        }
        else {
          (*(local_268.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_268.cstep = 0;
    local_268.data = (void *)0x0;
    local_268.refcount._0_4_ = 0;
    local_268.refcount._4_4_ = 0;
    local_268.elemsize._0_4_ = 0;
    local_268.elemsize._4_4_ = 0;
    local_268.elempack = 0;
    local_268.dims = 0;
    local_268.w = 0;
    local_268.h = 0;
    local_268.d = 0;
    local_268.c = 0;
    piVar35 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar35 != (int *)0x0) {
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128._20_8_ = 0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    piVar35 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar35 != (int *)0x0) {
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    iVar39 = 0;
  }
  piVar35 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar35 != (int *)0x0) {
    LOCK();
    *piVar35 = *piVar35 + -1;
    UNLOCK();
    if (*piVar35 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if (local_218.data != (void *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar39;
}

Assistant:

static int rnn_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const signed char* weight_xc_int8_ptr = weight_xc_int8.row<const signed char>(q);
            const signed char* weight_hc_int8_ptr = weight_hc_int8.row<const signed char>(q);

            const float descale_xc = 1.f / weight_xc_int8_scales[q];
            const float descale_hc = 1.f / weight_hc_int8_scales[q];

            int Hx = 0;
            for (int i = 0; i < size; i++)
            {
                Hx += weight_xc_int8_ptr[i] * x[i];
            }

            int Hh = 0;
            for (int i = 0; i < num_output; i++)
            {
                Hh += weight_hc_int8_ptr[i] * hs[i];
            }

            float H = bias_c[q] + Hx * (descale_x * descale_xc) + Hh * (descale_h * descale_hc);

            H = tanhf(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}